

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

void __thiscall wasm::ExtractFunctionIndex::~ExtractFunctionIndex(ExtractFunctionIndex *this)

{
  ExtractFunctionIndex *this_local;
  
  ~ExtractFunctionIndex(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override {
    std::string index =
      getPassOptions().getArgument("extract-function-index",
                                   "ExtractFunctionIndex usage: wasm-opt "
                                   "--extract-function-index=FUNCTION_INDEX");
    for (char c : index) {
      if (!std::isdigit(c)) {
        Fatal() << "Expected numeric function index";
      }
    }
    Index i = std::stoi(index);
    if (i >= module->functions.size()) {
      Fatal() << "Out of bounds function index " << i << "! (module has only "
              << module->functions.size() << " functions)";
    }
    // Assumes imports are at the beginning
    Name name = module->functions[i]->name;
    extract(getPassRunner(), module, name);
  }